

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.c
# Opt level: O0

void calc_grid(void)

{
  double dVar1;
  double time_step;
  int y2;
  int x2;
  int y;
  int x;
  
  dVar1 = dt * 10.0;
  for (x2 = 0; x2 < 0x32; x2 = x2 + 1) {
    for (y2 = 0; y2 < 0x32; y2 = y2 + 1) {
      ax[x2][y2] = p[x2][y2] - p[(x2 + 1) % 0x32][y2];
    }
  }
  for (y2 = 0; y2 < 0x32; y2 = y2 + 1) {
    for (x2 = 0; x2 < 0x32; x2 = x2 + 1) {
      ay[x2][y2] = p[x2][y2] - p[x2][(y2 + 1) % 0x32];
    }
  }
  for (x2 = 0; x2 < 0x32; x2 = x2 + 1) {
    for (y2 = 0; y2 < 0x32; y2 = y2 + 1) {
      vx[x2][y2] = ax[x2][y2] * dVar1 + vx[x2][y2];
      vy[x2][y2] = ay[x2][y2] * dVar1 + vy[x2][y2];
    }
  }
  for (x2 = 1; x2 < 0x32; x2 = x2 + 1) {
    for (y2 = 1; y2 < 0x32; y2 = y2 + 1) {
      p[x2][y2] = (((vx[x2 + -1][y2] - vx[x2][y2]) + vy[x2][y2 + -1]) - vy[x2][y2]) * dVar1 +
                  p[x2][y2];
    }
  }
  return;
}

Assistant:

void calc_grid(void)
{
    int x, y, x2, y2;
    double time_step = dt * ANIMATION_SPEED;

    // Compute accelerations
    for (x = 0;  x < GRIDW;  x++)
    {
        x2 = (x + 1) % GRIDW;
        for(y = 0; y < GRIDH; y++)
            ax[x][y] = p[x][y] - p[x2][y];
    }

    for (y = 0;  y < GRIDH;  y++)
    {
        y2 = (y + 1) % GRIDH;
        for(x = 0; x < GRIDW; x++)
            ay[x][y] = p[x][y] - p[x][y2];
    }

    // Compute speeds
    for (x = 0;  x < GRIDW;  x++)
    {
        for (y = 0;  y < GRIDH;  y++)
        {
            vx[x][y] = vx[x][y] + ax[x][y] * time_step;
            vy[x][y] = vy[x][y] + ay[x][y] * time_step;
        }
    }

    // Compute pressure
    for (x = 1;  x < GRIDW;  x++)
    {
        x2 = x - 1;
        for (y = 1;  y < GRIDH;  y++)
        {
            y2 = y - 1;
            p[x][y] = p[x][y] + (vx[x2][y] - vx[x][y] + vy[x][y2] - vy[x][y]) * time_step;
        }
    }
}